

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

action * Action_new(void)

{
  action *paVar1;
  int amt;
  int i;
  action *newaction;
  int local_c;
  
  if (Action_new::actionfreelist == (action *)0x0) {
    Action_new::actionfreelist = (action *)calloc(100,0x30);
    if (Action_new::actionfreelist == (action *)0x0) {
      fprintf(_stderr,"Unable to allocate memory for a new parser action.");
      exit(1);
    }
    for (local_c = 0; local_c < 99; local_c = local_c + 1) {
      Action_new::actionfreelist[local_c].next = Action_new::actionfreelist + (local_c + 1);
    }
    Action_new::actionfreelist[99].next = (action *)0x0;
  }
  paVar1 = Action_new::actionfreelist;
  Action_new::actionfreelist = Action_new::actionfreelist->next;
  return paVar1;
}

Assistant:

static struct action *Action_new(void){
  static struct action *actionfreelist = 0;
  struct action *newaction;

  if( actionfreelist==0 ){
    int i;
    int amt = 100;
    actionfreelist = (struct action *)calloc(amt, sizeof(struct action));
    if( actionfreelist==0 ){
      fprintf(stderr,"Unable to allocate memory for a new parser action.");
      exit(1);
    }
    for(i=0; i<amt-1; i++) actionfreelist[i].next = &actionfreelist[i+1];
    actionfreelist[amt-1].next = 0;
  }
  newaction = actionfreelist;
  actionfreelist = actionfreelist->next;
  return newaction;
}